

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

void next_level(boolean at_stairs)

{
  d_level newlevel;
  d_level local_2;
  
  if (((at_stairs != '\0') && (u.ux == (level->sstairs).sx)) && (u.uy == (level->sstairs).sy)) {
    goto_level(&(level->sstairs).tolev,at_stairs,'\0','\0');
    return;
  }
  goto_level(&local_2,at_stairs,at_stairs == '\0','\0');
  return;
}

Assistant:

void next_level(boolean at_stairs)
{
	if (at_stairs && u.ux == level->sstairs.sx && u.uy == level->sstairs.sy) {
		/* Taking a down dungeon branch. */
		goto_level(&level->sstairs.tolev, at_stairs, FALSE, FALSE);
	} else {
		/* Going down a stairs or jump in a trap door. */
		d_level	newlevel;

		newlevel.dnum = u.uz.dnum;
		newlevel.dlevel = u.uz.dlevel + 1;
		goto_level(&newlevel, at_stairs, !at_stairs, FALSE);
	}
}